

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)74,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)3,_1> local_74;
  int local_60;
  Ea<(moira::Mode)3,_2> local_58;
  int local_44;
  Ea<(moira::Mode)3,_1> local_3c;
  int local_28;
  byte local_23;
  u16 local_22;
  u8 src;
  u32 *puStack_20;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22._0_1_ = (byte)op;
  local_23 = (byte)local_22 & 7;
  SVar1 = str->style->syntax;
  local_22 = op;
  puStack_20 = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (SVar1 - GNU < 2) {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    local_44 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_44);
    Op<(moira::Mode)3,2>(&local_58,this,(ushort)local_23,puStack_20);
    pSVar2 = StrWriter::operator<<(pSVar2,&local_58);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2);
  }
  else if (SVar1 == MUSASHI) {
    pSVar2 = StrWriter::operator<<(str);
    local_28 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_28);
    Op<(moira::Mode)3,1>(&local_3c,this,(ushort)local_23,puStack_20);
    pSVar2 = StrWriter::operator<<(pSVar2,&local_3c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2);
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    local_60 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_60);
    Op<(moira::Mode)3,1>(&local_74,this,(ushort)local_23,puStack_20);
    pSVar2 = StrWriter::operator<<(pSVar2,&local_74);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2);
  }
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = _____________xxx(op);

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, S>(src, addr) << Sep{} << Ccr{};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Op<M, Byte>(src, addr) << Sep{} << Ccr{};
    }
}